

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O0

int32_t get_upscale_convolve_x0(int in_length,int out_length,int32_t x_step_qn)

{
  int32_t x0;
  int err;
  int32_t x_step_qn_local;
  int out_length_local;
  int in_length_local;
  
  return (((out_length - in_length) * -0x2000 + out_length / 2) / out_length + 0x80) -
         (out_length * x_step_qn + in_length * -0x4000) / 2 & 0x3fff;
}

Assistant:

static int32_t get_upscale_convolve_x0(int in_length, int out_length,
                                       int32_t x_step_qn) {
  const int err = out_length * x_step_qn - (in_length << RS_SCALE_SUBPEL_BITS);
  const int32_t x0 =
      (-((out_length - in_length) << (RS_SCALE_SUBPEL_BITS - 1)) +
       out_length / 2) /
          out_length +
      RS_SCALE_EXTRA_OFF - err / 2;
  return (int32_t)((uint32_t)x0 & RS_SCALE_SUBPEL_MASK);
}